

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

char * fmt::v7::detail::
       parse_format_specs<char,fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>>&>
                 (char *begin,char *end,
                 specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>
                 *handler)

{
  char cVar1;
  specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>
  *in_RDX;
  char *in_RSI;
  char *in_RDI;
  char *unaff_retaddr;
  char *in_stack_00000020;
  char *in_stack_00000028;
  char *local_10;
  specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>
  *in_stack_fffffffffffffff8;
  
  local_10 = in_RDI;
  if ((in_RDI != in_RSI) &&
     (local_10 = parse_align<char,fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>>&>
                           (in_stack_00000028,in_stack_00000020,
                            (specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>
                             *)begin), local_10 != in_RSI)) {
    cVar1 = to_ascii<char,_0>(*local_10);
    if (cVar1 == ' ') {
      specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>
      ::on_space(in_RDX);
      local_10 = local_10 + 1;
    }
    else if (cVar1 == '+') {
      specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>
      ::on_plus(in_RDX);
      local_10 = local_10 + 1;
    }
    else if (cVar1 == '-') {
      specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>
      ::on_minus(in_RDX);
      local_10 = local_10 + 1;
    }
    if (local_10 != in_RSI) {
      if (*local_10 == '#') {
        specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>
        ::on_hash(in_RDX);
        local_10 = local_10 + 1;
        if (local_10 == in_RSI) {
          return local_10;
        }
      }
      if (*local_10 == '0') {
        specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,_fmt::v7::detail::error_handler>_>_>
        ::on_zero(in_RDX);
        if (local_10 + 1 == in_RSI) {
          return local_10 + 1;
        }
      }
      local_10 = parse_width<char,fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>>&>
                           ((char *)handler,unaff_retaddr,in_stack_fffffffffffffff8);
      if (local_10 != in_RSI) {
        if (*local_10 == '.') {
          local_10 = parse_precision<char,fmt::v7::detail::specs_checker<fmt::v7::detail::dynamic_specs_handler<fmt::v7::basic_format_parse_context<char,fmt::v7::detail::error_handler>>>&>
                               (begin,end,handler);
        }
        if ((local_10 != in_RSI) && (*local_10 != '}')) {
          specs_setter<char>::on_type((specs_setter<char> *)in_RDX,*local_10);
          local_10 = local_10 + 1;
        }
      }
    }
  }
  return local_10;
}

Assistant:

FMT_CONSTEXPR const Char* parse_format_specs(const Char* begin, const Char* end,
                                             SpecHandler&& handler) {
  if (begin == end) return begin;

  begin = parse_align(begin, end, handler);
  if (begin == end) return begin;

  // Parse sign.
  switch (to_ascii(*begin)) {
  case '+':
    handler.on_plus();
    ++begin;
    break;
  case '-':
    handler.on_minus();
    ++begin;
    break;
  case ' ':
    handler.on_space();
    ++begin;
    break;
  }
  if (begin == end) return begin;

  if (*begin == '#') {
    handler.on_hash();
    if (++begin == end) return begin;
  }

  // Parse zero flag.
  if (*begin == '0') {
    handler.on_zero();
    if (++begin == end) return begin;
  }

  begin = parse_width(begin, end, handler);
  if (begin == end) return begin;

  // Parse precision.
  if (*begin == '.') {
    begin = parse_precision(begin, end, handler);
  }

  // Parse type.
  if (begin != end && *begin != '}') handler.on_type(*begin++);
  return begin;
}